

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

sparse_array_n<bool,_2,_std::allocator<bool>_> *
advance_board(sparse_array_n<bool,_2,_std::allocator<bool>_> *__return_storage_ptr__,
             sparse_array_n<bool,_2,_std::allocator<bool>_> *board,int *m,int *n)

{
  bool *pbVar1;
  uint local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  int nbrs;
  uint j;
  uint i;
  int *n_local;
  int *m_local;
  sparse_array_n<bool,_2,_std::allocator<bool>_> *board_local;
  sparse_array_n<bool,_2,_std::allocator<bool>_> *new_board;
  
  j._3_1_ = 0;
  j._2_1_ = 0;
  _i = (uint *)n;
  n_local = m;
  m_local = (int *)board;
  board_local = __return_storage_ptr__;
  sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::sparse_array_n
            (__return_storage_ptr__,(bool *)((long)&j + 2),*m,(ulong)(uint)*n);
  for (nbrs = 0; (uint)nbrs < (uint)*n_local; nbrs = nbrs + 1) {
    for (local_34 = 0; local_34 < *_i; local_34 = local_34 + 1) {
      local_3c = nbrs;
      local_40 = local_34;
      local_38 = count_neighbours((sparse_array_n<bool,_2,_std::allocator<bool>_> *)m_local,n_local,
                                  (int *)_i,&local_3c,(int *)&local_40);
      pbVar1 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()
                         ((sparse_array_n<bool,_2,_std::allocator<bool>_> *)m_local,nbrs,
                          (ulong)local_34);
      if ((*pbVar1 & 1U) == 0) {
        if (local_38 == 3) {
          pbVar1 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()
                             (__return_storage_ptr__,nbrs,(ulong)local_34);
          *pbVar1 = true;
        }
      }
      else if ((local_38 == 2) || (local_38 == 3)) {
        pbVar1 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()
                           (__return_storage_ptr__,nbrs,(ulong)local_34);
        *pbVar1 = true;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sisl::sparse_array_n<bool, 2> advance_board(const sisl::sparse_array_n<bool, 2> &board, const int &m, const int &n) {
	sisl::sparse_array_n<bool, 2> new_board(false, m,n);

	for(uint i = 0; i < m; i++)
		for(uint j = 0; j < n; j++) {
			int nbrs = count_neighbours(board, m, n, i, j);

			if(board(i,j)) {
			 	if(nbrs == 2 || nbrs == 3)
					new_board(i,j) = true;

			} else if(nbrs == 3) {
				new_board(i,j) = true;
			}
		}
	return new_board;
}